

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::get_curv_edge_vert_flips
          (Omega_h *this,Mesh *mesh,Adj *curv_verts2edges,LOs *edge2curv_edge)

{
  int *piVar1;
  int iVar2;
  LOs *pLVar3;
  LO LVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar5;
  long lVar6;
  long lVar7;
  Alloc *pAVar8;
  Alloc *this_00;
  Read<signed_char> RVar9;
  Write<signed_char> out;
  Read<signed_char> in;
  type f;
  Write<signed_char> local_198;
  Write<signed_char> local_188;
  Alloc *local_178;
  long local_170;
  Adj local_168;
  Alloc *local_138;
  void *local_130;
  Alloc *local_128;
  long local_120;
  Adj local_118;
  Alloc *local_e8;
  void *pvStack_e0;
  Alloc *local_d8;
  long lStack_d0;
  LOs local_c0;
  Adj local_b0;
  Adj local_80;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  long local_38;
  
  local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_b0.codes.write_.shared_alloc_.alloc = (curv_verts2edges->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_b0.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.codes.write_.shared_alloc_.alloc)->use_count =
           (local_b0.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.codes.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->codes).write_.shared_alloc_.direct_ptr;
  local_c0.write_.shared_alloc_.alloc = (edge2curv_edge->write_).shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc =
           (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.write_.shared_alloc_.alloc)->use_count =
           (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar8 = local_c0.write_.shared_alloc_.alloc;
  local_c0.write_.shared_alloc_.direct_ptr = (edge2curv_edge->write_).shared_alloc_.direct_ptr;
  get_curv_vert_edge_flips((Omega_h *)&local_178,&local_b0,&local_c0);
  if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
    piVar1 = &pAVar8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  Adj::~Adj(&local_b0);
  LVar4 = Mesh::nedges(mesh);
  pLVar3 = &local_168.super_Graph.ab2b;
  local_168.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
  Write<signed_char>::Write(&local_198,LVar4 * 2,'\0',(string *)&local_168);
  if (local_168.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar3) {
    operator_delete(local_168.super_Graph.a2ab.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_168.super_Graph.ab2b.write_.shared_alloc_.alloc)->size + 1
                           ));
  }
  LVar4 = Graph::nnodes(&curv_verts2edges->super_Graph);
  local_80.super_Graph.a2ab.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_80.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_80.super_Graph.ab2b.write_.shared_alloc_.alloc =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_80.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_80.codes.write_.shared_alloc_.alloc = (curv_verts2edges->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_80.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.codes.write_.shared_alloc_.alloc)->use_count =
           (local_80.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.codes.write_.shared_alloc_.direct_ptr =
       (curv_verts2edges->codes).write_.shared_alloc_.direct_ptr;
  local_50 = local_198.shared_alloc_.alloc;
  if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
      local_198.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_198.shared_alloc_.alloc)->use_count = (local_198.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48 = local_198.shared_alloc_.direct_ptr;
  local_40 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_38 = local_170;
  local_118.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_80.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_80.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_80.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_80.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_80.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_80.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.codes.write_.shared_alloc_.alloc = local_80.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_80.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.codes.write_.shared_alloc_.alloc)->use_count =
           (local_80.codes.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e8 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pvStack_e0 = local_198.shared_alloc_.direct_ptr;
  local_d8 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pAVar8 = local_d8;
  lStack_d0 = local_170;
  if (LVar4 < 1) {
    local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         local_80.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_118.codes.write_.shared_alloc_.direct_ptr = local_80.codes.write_.shared_alloc_.direct_ptr
    ;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      piVar1 = &local_d8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8);
        operator_delete(pAVar8,0x48);
      }
    }
    pAVar8 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      piVar1 = &local_e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8);
        operator_delete(pAVar8,0x48);
      }
    }
  }
  else {
    local_168.super_Graph.a2ab.write_.shared_alloc_.alloc =
         local_118.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_118.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + -1;
      local_168.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_118.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_118.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_168.super_Graph.ab2b.write_.shared_alloc_.alloc =
         local_118.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_118.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + -1;
      local_168.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_118.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_118.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_168.codes.write_.shared_alloc_.alloc = local_118.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_118.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      (local_118.codes.write_.shared_alloc_.alloc)->use_count =
           (local_118.codes.write_.shared_alloc_.alloc)->use_count + -1;
      local_168.codes.write_.shared_alloc_.alloc =
           (Alloc *)((local_118.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_118.codes.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_118.codes.write_.shared_alloc_.direct_ptr = (void *)0x0;
    local_130 = local_198.shared_alloc_.direct_ptr;
    pAVar8 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      pAVar8 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    pvStack_e0 = (void *)0x0;
    local_120 = local_170;
    this_00 = local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      this_00 = (Alloc *)(local_d8->size * 8 + 1);
    }
    local_d8 = (Alloc *)0x0;
    lStack_d0 = 0;
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      iVar2 = *(int *)((long)local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr + lVar6 * 4);
      lVar7 = (long)iVar2;
      if (iVar2 < *(int *)((long)local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                          lVar6 * 4 + 4)) {
        do {
          *(undefined1 *)
           ((long)local_198.shared_alloc_.direct_ptr +
           (long)*(int *)((long)local_80.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                         lVar7 * 4) * 2 +
           (long)(*(char *)((long)local_80.codes.write_.shared_alloc_.direct_ptr + lVar7) >> 3)) =
               *(undefined1 *)(local_170 + lVar7);
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 lVar6 * 4 + 4));
      }
      lVar6 = lVar6 + 1;
    } while (LVar4 != (int)lVar6);
    local_168.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         local_80.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_168.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         local_80.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_168.codes.write_.shared_alloc_.direct_ptr = local_80.codes.write_.shared_alloc_.direct_ptr
    ;
    local_138 = pAVar8;
    local_128 = this_00;
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar8 & 7) == 0 && pAVar8 != (Alloc *)0x0) {
      piVar1 = &pAVar8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar8);
        operator_delete(pAVar8,0x48);
      }
    }
    Adj::~Adj(&local_168);
  }
  Adj::~Adj(&local_118);
  local_188.shared_alloc_.alloc = local_198.shared_alloc_.alloc;
  local_188.shared_alloc_.direct_ptr = local_198.shared_alloc_.direct_ptr;
  if ((((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
       local_198.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_198.shared_alloc_.alloc)->use_count = (local_198.shared_alloc_.alloc)->use_count + -1;
    local_188.shared_alloc_.alloc = (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_198.shared_alloc_.alloc = (Alloc *)0x0;
  local_198.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_188);
  pAVar8 = local_188.shared_alloc_.alloc;
  if (((ulong)local_188.shared_alloc_.alloc & 7) == 0 &&
      local_188.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(pAVar8,0x48);
    }
  }
  Adj::~Adj(&local_80);
  pAVar8 = local_198.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
      local_198.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    piVar1 = &local_178->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178);
      operator_delete(local_178,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<I8> get_curv_edge_vert_flips(
    Mesh* mesh, Adj curv_verts2edges, LOs edge2curv_edge) {
  auto in = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto out = Write<I8>(mesh->nedges() * 2, I8(0));
  auto ncurv_verts = curv_verts2edges.nnodes();
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    for (auto ve = curv_verts2edges.a2ab[curv_vert];
         ve < curv_verts2edges.a2ab[curv_vert + 1]; ++ve) {
      auto e = curv_verts2edges.ab2b[ve];
      auto code = curv_verts2edges.codes[ve];
      auto eev = code_which_down(code);
      out[e * 2 + eev] = in[ve];
    }
  };
  parallel_for(ncurv_verts, f, "get_curv_edge_vert_flips");
  return out;
}